

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::~ansicolor_sink
          (ansicolor_sink<spdlog::details::console_nullmutex> *this)

{
  pointer pcVar1;
  formatter *pfVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  
  (this->super_sink)._vptr_sink = (_func_int **)&PTR__ansicolor_sink_0032b8f0;
  paVar3 = &(this->colors_)._M_elems[6].field_2;
  lVar4 = -0xe0;
  do {
    pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar3 + -1))->
             _M_dataplus)._M_p;
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1) {
      operator_delete(pcVar1);
    }
    paVar3 = paVar3 + -2;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  pfVar2 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  if (pfVar2 != (formatter *)0x0) {
    (*pfVar2->_vptr_formatter[1])();
  }
  (this->formatter_)._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  return;
}

Assistant:

~ansicolor_sink() override = default;